

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *jp2,opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  opj_jp2_img_header_writer_handler_t *poVar1;
  OPJ_SIZE_T OVar2;
  OPJ_BYTE local_a8 [4];
  OPJ_BYTE aOStack_a4 [4];
  OPJ_BYTE l_jp2h_data [8];
  OPJ_BOOL l_result;
  OPJ_UINT32 l_jp2h_size;
  OPJ_INT32 l_nb_pass;
  OPJ_INT32 i;
  opj_jp2_img_header_writer_handler_t *l_current_writer;
  opj_jp2_img_header_writer_handler_t l_writers [4];
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *stream_local;
  opj_jp2_t *jp2_local;
  
  l_jp2h_data[4] = '\b';
  l_jp2h_data[5] = '\0';
  l_jp2h_data[6] = '\0';
  l_jp2h_data[7] = '\0';
  l_jp2h_data[0] = '\x01';
  l_jp2h_data[1] = '\0';
  l_jp2h_data[2] = '\0';
  l_jp2h_data[3] = '\0';
  l_writers[3]._16_8_ = p_manager;
  if (stream == (opj_stream_private_t *)0x0) {
    __assert_fail("stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x61e,
                  "OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x61f,
                  "OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x620,
                  "OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  memset(&l_current_writer,0,0x60);
  if (jp2->bpc == 0xff) {
    l_result = 3;
    l_writers[0]._16_8_ = opj_jp2_write_bpcc;
    l_writers[1]._16_8_ = opj_jp2_write_colr;
  }
  else {
    l_result = 2;
    l_writers[0]._16_8_ = opj_jp2_write_colr;
  }
  l_current_writer = (opj_jp2_img_header_writer_handler_t *)opj_jp2_write_ihdr;
  if ((jp2->color).jp2_cdef != (opj_jp2_cdef_t *)0x0) {
    *(code **)&l_writers[(long)l_result + -1].m_size = opj_jp2_write_cdef;
    l_result = l_result + 1;
  }
  opj_write_bytes_LE(aOStack_a4,0x6a703268,4);
  _l_nb_pass = &l_current_writer;
  for (l_jp2h_size = 0; (int)l_jp2h_size < l_result; l_jp2h_size = l_jp2h_size + 1) {
    poVar1 = (opj_jp2_img_header_writer_handler_t *)(*(code *)*_l_nb_pass)(jp2,_l_nb_pass + 2);
    _l_nb_pass[1] = poVar1;
    if (_l_nb_pass[1] == (opj_jp2_img_header_writer_handler_t *)0x0) {
      opj_event_msg((opj_event_mgr_t *)l_writers[3]._16_8_,1,
                    "Not enough memory to hold JP2 Header data\n");
      l_jp2h_data[0] = '\0';
      l_jp2h_data[1] = '\0';
      l_jp2h_data[2] = '\0';
      l_jp2h_data[3] = '\0';
      break;
    }
    l_jp2h_data._4_4_ = *(int *)(_l_nb_pass + 2) + l_jp2h_data._4_4_;
    _l_nb_pass = _l_nb_pass + 3;
  }
  if (l_jp2h_data._0_4_ == 0) {
    _l_nb_pass = &l_current_writer;
    for (l_jp2h_size = 0; (int)l_jp2h_size < l_result; l_jp2h_size = l_jp2h_size + 1) {
      if (_l_nb_pass[1] != (opj_jp2_img_header_writer_handler_t *)0x0) {
        opj_free(_l_nb_pass[1]);
      }
      _l_nb_pass = _l_nb_pass + 3;
    }
    jp2_local._4_4_ = 0;
  }
  else {
    opj_write_bytes_LE(local_a8,l_jp2h_data._4_4_,4);
    OVar2 = opj_stream_write_data(stream,local_a8,8,(opj_event_mgr_t *)l_writers[3]._16_8_);
    if (OVar2 != 8) {
      opj_event_msg((opj_event_mgr_t *)l_writers[3]._16_8_,1,
                    "Stream error while writing JP2 Header box\n");
      l_jp2h_data[0] = '\0';
      l_jp2h_data[1] = '\0';
      l_jp2h_data[2] = '\0';
      l_jp2h_data[3] = '\0';
    }
    if (l_jp2h_data._0_4_ != 0) {
      _l_nb_pass = &l_current_writer;
      for (l_jp2h_size = 0; (int)l_jp2h_size < l_result; l_jp2h_size = l_jp2h_size + 1) {
        OVar2 = opj_stream_write_data
                          (stream,(OPJ_BYTE *)_l_nb_pass[1],(ulong)*(uint *)(_l_nb_pass + 2),
                           (opj_event_mgr_t *)l_writers[3]._16_8_);
        if (OVar2 != *(uint *)(_l_nb_pass + 2)) {
          opj_event_msg((opj_event_mgr_t *)l_writers[3]._16_8_,1,
                        "Stream error while writing JP2 Header box\n");
          l_jp2h_data[0] = '\0';
          l_jp2h_data[1] = '\0';
          l_jp2h_data[2] = '\0';
          l_jp2h_data[3] = '\0';
          break;
        }
        _l_nb_pass = _l_nb_pass + 3;
      }
    }
    _l_nb_pass = &l_current_writer;
    for (l_jp2h_size = 0; (int)l_jp2h_size < l_result; l_jp2h_size = l_jp2h_size + 1) {
      if (_l_nb_pass[1] != (opj_jp2_img_header_writer_handler_t *)0x0) {
        opj_free(_l_nb_pass[1]);
      }
      _l_nb_pass = _l_nb_pass + 3;
    }
    jp2_local._4_1_ = l_jp2h_data[0];
    jp2_local._5_1_ = l_jp2h_data[1];
    jp2_local._6_1_ = l_jp2h_data[2];
    jp2_local._7_1_ = l_jp2h_data[3];
  }
  return jp2_local._4_4_;
}

Assistant:

static OPJ_BOOL opj_jp2_write_jp2h(opj_jp2_t *jp2,
                            opj_stream_private_t *stream,
                            opj_event_mgr_t * p_manager
                            )
{
	opj_jp2_img_header_writer_handler_t l_writers [4];
	opj_jp2_img_header_writer_handler_t * l_current_writer;

	OPJ_INT32 i, l_nb_pass;
	/* size of data for super box*/
	OPJ_UINT32 l_jp2h_size = 8;
	OPJ_BOOL l_result = OPJ_TRUE;

	/* to store the data of the super box */
	OPJ_BYTE l_jp2h_data [8];
	
	/* preconditions */
	assert(stream != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	memset(l_writers,0,sizeof(l_writers));

	if (jp2->bpc == 255) {
		l_nb_pass = 3;
		l_writers[0].handler = opj_jp2_write_ihdr;
		l_writers[1].handler = opj_jp2_write_bpcc;
		l_writers[2].handler = opj_jp2_write_colr;
	}
	else {
		l_nb_pass = 2;
		l_writers[0].handler = opj_jp2_write_ihdr;
		l_writers[1].handler = opj_jp2_write_colr;
	}
	
	if (jp2->color.jp2_cdef != NULL) {
		l_writers[l_nb_pass].handler = opj_jp2_write_cdef;
		l_nb_pass++;
	}
	
	/* write box header */
	/* write JP2H type */
	opj_write_bytes(l_jp2h_data+4,JP2_JP2H,4);

	l_current_writer = l_writers;
	for (i=0;i<l_nb_pass;++i) {
		l_current_writer->m_data = l_current_writer->handler(jp2,&(l_current_writer->m_size));
		if (l_current_writer->m_data == 00) {
			opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to hold JP2 Header data\n");
			l_result = OPJ_FALSE;
			break;
		}

		l_jp2h_size += l_current_writer->m_size;
		++l_current_writer;
	}

	if (! l_result) {
		l_current_writer = l_writers;
		for (i=0;i<l_nb_pass;++i) {
			if (l_current_writer->m_data != 00) {
				opj_free(l_current_writer->m_data );
			}
			++l_current_writer;
		}

		return OPJ_FALSE;
	}

	/* write super box size */
	opj_write_bytes(l_jp2h_data,l_jp2h_size,4);
	
	/* write super box data on stream */
	if (opj_stream_write_data(stream,l_jp2h_data,8,p_manager) != 8) {
		opj_event_msg(p_manager, EVT_ERROR, "Stream error while writing JP2 Header box\n");
		l_result = OPJ_FALSE;
	}
	
	if (l_result) {
		l_current_writer = l_writers;
		for (i=0;i<l_nb_pass;++i) {
			if (opj_stream_write_data(stream,l_current_writer->m_data,l_current_writer->m_size,p_manager) != l_current_writer->m_size) {
				opj_event_msg(p_manager, EVT_ERROR, "Stream error while writing JP2 Header box\n");
				l_result = OPJ_FALSE;
				break;
			}
			++l_current_writer;
		}
	}

	l_current_writer = l_writers;
	
	/* cleanup */
	for (i=0;i<l_nb_pass;++i) {
		if (l_current_writer->m_data != 00) {
			opj_free(l_current_writer->m_data );
		}
		++l_current_writer;
	}

	return l_result;
}